

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_config_set(char *key,char *value)

{
  char *__s;
  char *key_00;
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_261;
  string local_260;
  RuntimeConfig local_240 [2];
  Log local_220;
  char *local_18;
  char *value_local;
  char *key_local;
  
  local_18 = value;
  value_local = key;
  bVar1 = cali::Caliper::is_initialized();
  if (bVar1) {
    cali::Log::Log(&local_220,0);
    poVar2 = cali::Log::stream(&local_220);
    poVar2 = std::operator<<(poVar2,"Warning: Caliper is already initialized. ");
    poVar2 = std::operator<<(poVar2,"cali_config_set(\"");
    poVar2 = std::operator<<(poVar2,value_local);
    poVar2 = std::operator<<(poVar2,"\", \"");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\") has no effect.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_220);
  }
  cali::RuntimeConfig::get_default_config();
  key_00 = value_local;
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,__s,&local_261);
  cali::RuntimeConfig::set(local_240,key_00,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  cali::RuntimeConfig::~RuntimeConfig(local_240);
  return;
}

Assistant:

void cali_config_set(const char* key, const char* value)
{
    if (Caliper::is_initialized())
        Log(0).stream() << "Warning: Caliper is already initialized. "
                        << "cali_config_set(\"" << key << "\", \"" << value << "\") has no effect." << std::endl;

    RuntimeConfig::get_default_config().set(key, value);
}